

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesFrequencyOcGetMode(zes_freq_handle_t hFrequency,zes_oc_mode_t *pCurrentOcMode)

{
  zes_pfnFrequencyOcGetMode_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFrequencyOcGetMode_t pfnOcGetMode;
  zes_oc_mode_t *pCurrentOcMode_local;
  zes_freq_handle_t hFrequency_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Frequency).pfnOcGetMode;
    if (p_Var1 == (zes_pfnFrequencyOcGetMode_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFrequency_local._4_4_ = (*p_Var1)(hFrequency,pCurrentOcMode);
    }
  }
  else {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFrequency_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFrequencyOcGetMode(
    zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
    zes_oc_mode_t* pCurrentOcMode                   ///< [out] Current Overclocking Mode ::zes_oc_mode_t.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFrequencyOcGetMode_t pfnOcGetMode = [&result] {
        auto pfnOcGetMode = ze_lib::context->zesDdiTable.load()->Frequency.pfnOcGetMode;
        if( nullptr == pfnOcGetMode ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnOcGetMode;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnOcGetMode( hFrequency, pCurrentOcMode );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnOcGetMode = ze_lib::context->zesDdiTable.load()->Frequency.pfnOcGetMode;
    if( nullptr == pfnOcGetMode ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnOcGetMode( hFrequency, pCurrentOcMode );
    #endif
}